

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

void ExtractAlphaRows(VP8LDecoder *dec,int last_row)

{
  int stride;
  uint32_t *puVar1;
  ALPHDecoder *alph_dec;
  uint32_t *rows;
  uint8_t *out;
  uint uVar2;
  int start_row;
  ulong uVar3;
  int num_rows;
  ulong uVar4;
  
  uVar3 = (ulong)dec->last_row_;
  rows = dec->pixels_ + (long)dec->width_ * uVar3;
  for (uVar2 = last_row - dec->last_row_; 0 < (int)uVar2; uVar2 = uVar2 - num_rows) {
    uVar4 = 0x10;
    if (uVar2 < 0x10) {
      uVar4 = (ulong)uVar2;
    }
    puVar1 = dec->argb_cache_;
    alph_dec = (ALPHDecoder *)dec->io_->opaque;
    stride = dec->io_->width;
    num_rows = (int)uVar4;
    start_row = (int)uVar3;
    out = alph_dec->output_ + stride * start_row;
    ApplyInverseTransforms(dec,start_row,num_rows,rows);
    (*WebPExtractGreen)(puVar1,out,stride * num_rows);
    AlphaApplyFilter(alph_dec,start_row,start_row + num_rows,out,stride);
    rows = rows + uVar4 * (long)dec->width_;
    uVar3 = (ulong)(uint)(start_row + num_rows);
  }
  dec->last_out_row_ = last_row;
  dec->last_row_ = last_row;
  return;
}

Assistant:

static void ExtractAlphaRows(VP8LDecoder* const dec, int last_row) {
  int cur_row = dec->last_row_;
  int num_rows = last_row - cur_row;
  const uint32_t* in = dec->pixels_ + dec->width_ * cur_row;

  assert(last_row <= dec->io_->crop_bottom);
  while (num_rows > 0) {
    const int num_rows_to_process =
        (num_rows > NUM_ARGB_CACHE_ROWS) ? NUM_ARGB_CACHE_ROWS : num_rows;
    // Extract alpha (which is stored in the green plane).
    ALPHDecoder* const alph_dec = (ALPHDecoder*)dec->io_->opaque;
    uint8_t* const output = alph_dec->output_;
    const int width = dec->io_->width;      // the final width (!= dec->width_)
    const int cache_pixs = width * num_rows_to_process;
    uint8_t* const dst = output + width * cur_row;
    const uint32_t* const src = dec->argb_cache_;
    ApplyInverseTransforms(dec, cur_row, num_rows_to_process, in);
    WebPExtractGreen(src, dst, cache_pixs);
    AlphaApplyFilter(alph_dec,
                     cur_row, cur_row + num_rows_to_process, dst, width);
    num_rows -= num_rows_to_process;
    in += num_rows_to_process * dec->width_;
    cur_row += num_rows_to_process;
  }
  assert(cur_row == last_row);
  dec->last_row_ = dec->last_out_row_ = last_row;
}